

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  int i_1;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  int i_2;
  int iVar10;
  ulong uVar11;
  int i_5;
  int iVar12;
  void *pvVar13;
  int j_4;
  ulong uVar14;
  int j_1;
  long lVar15;
  int j_7;
  int q;
  int iVar16;
  int iVar17;
  int iVar18;
  int i;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Mat sum;
  Mat max;
  Mat local_70;
  
  uVar5 = bottom_top_blob->dims;
  if (uVar5 == 1) {
    pvVar7 = bottom_top_blob->data;
    uVar6 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar11 = uVar6;
    }
    fVar21 = -3.4028235e+38;
    for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      fVar22 = *(float *)((long)pvVar7 + uVar6 * 4);
      if (fVar21 <= fVar22) {
        fVar21 = fVar22;
      }
    }
    fVar22 = 0.0;
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      fVar20 = expf(*(float *)((long)pvVar7 + uVar6 * 4) - fVar21);
      *(float *)((long)pvVar7 + uVar6 * 4) = fVar20;
      fVar22 = fVar22 + fVar20;
    }
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      *(float *)((long)pvVar7 + uVar6 * 4) = *(float *)((long)pvVar7 + uVar6 * 4) * (1.0 / fVar22);
    }
    return 0;
  }
  sVar2 = bottom_top_blob->elemsize;
  uVar1 = this->axis;
  if ((uVar5 ^ 2) == 0 && uVar1 == 0) {
    uVar5 = bottom_top_blob->w;
    uVar1 = bottom_top_blob->h;
    max.elemsize._0_4_ = 0;
    max.elemsize._4_4_ = 0;
    max.elempack = 0;
    max.data = (void *)0x0;
    max.refcount._0_4_ = 0;
    max.refcount._4_4_ = 0;
    max.allocator = (Allocator *)0x0;
    max.dims = 0;
    max.w = 0;
    max.h = 0;
    max.c = 0;
    max.cstep = 0;
    Mat::create(&max,uVar5,sVar2,opt->workspace_allocator);
    iVar16 = -100;
    if ((max.data != (void *)0x0) && ((long)max.c * max.cstep != 0)) {
      Mat::fill(&max,-3.4028235e+38);
      pvVar7 = bottom_top_blob->data;
      iVar17 = bottom_top_blob->w;
      uVar11 = 0;
      uVar6 = 0;
      if (0 < (int)uVar5) {
        uVar6 = (ulong)uVar5;
      }
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar8 = uVar11;
      }
      sVar3 = bottom_top_blob->elemsize;
      for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
        for (uVar14 = 0; uVar6 != uVar14; uVar14 = uVar14 + 1) {
          fVar21 = *(float *)((long)pvVar7 + uVar14 * 4);
          fVar22 = *(float *)((long)max.data + uVar14 * 4);
          if (fVar21 <= fVar22) {
            fVar21 = fVar22;
          }
          *(float *)((long)max.data + uVar14 * 4) = fVar21;
        }
        pvVar7 = (void *)((long)pvVar7 + (long)iVar17 * sVar3);
      }
      sum.elemsize._0_4_ = 0;
      sum.elemsize._4_4_ = 0;
      sum.elempack = 0;
      sum.data = (void *)0x0;
      sum.refcount._0_4_ = 0;
      sum.refcount._4_4_ = 0;
      sum.allocator = (Allocator *)0x0;
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.c = 0;
      sum.cstep = 0;
      Mat::create(&sum,uVar5,sVar2,opt->workspace_allocator);
      iVar16 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        pvVar7 = bottom_top_blob->data;
        iVar17 = bottom_top_blob->w;
        sVar2 = bottom_top_blob->elemsize;
        for (uVar11 = 0; pvVar13 = max.data, pvVar4 = sum.data, uVar11 != uVar8; uVar11 = uVar11 + 1
            ) {
          for (uVar14 = 0; uVar6 != uVar14; uVar14 = uVar14 + 1) {
            fVar21 = expf(*(float *)((long)pvVar7 + uVar14 * 4) -
                          *(float *)((long)pvVar13 + uVar14 * 4));
            *(float *)((long)pvVar7 + uVar14 * 4) = fVar21;
            *(float *)((long)pvVar4 + uVar14 * 4) = fVar21 + *(float *)((long)pvVar4 + uVar14 * 4);
          }
          pvVar7 = (void *)((long)pvVar7 + (long)iVar17 * sVar2);
        }
        pvVar7 = bottom_top_blob->data;
        iVar17 = bottom_top_blob->w;
        sVar2 = bottom_top_blob->elemsize;
        iVar16 = 0;
        for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
          for (uVar14 = 0; uVar6 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar7 + uVar14 * 4) =
                 *(float *)((long)pvVar7 + uVar14 * 4) / *(float *)((long)sum.data + uVar14 * 4);
          }
          pvVar7 = (void *)((long)pvVar7 + (long)iVar17 * sVar2);
        }
      }
      Mat::~Mat(&sum);
    }
  }
  else {
    if ((uVar5 ^ 2) == 0 && (uVar1 ^ 1) == 0) {
      uVar5 = bottom_top_blob->w;
      uVar11 = 0;
      if (0 < (int)uVar5) {
        uVar11 = (ulong)uVar5;
      }
      pvVar7 = bottom_top_blob->data;
      uVar1 = bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar1 = 0;
      }
      for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
        fVar21 = -3.4028235e+38;
        for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar7 + uVar8 * 4);
          if (fVar21 <= fVar22) {
            fVar21 = fVar22;
          }
        }
        fVar22 = 0.0;
        for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
          fVar20 = expf(*(float *)((long)pvVar7 + uVar8 * 4) - fVar21);
          *(float *)((long)pvVar7 + uVar8 * 4) = fVar20;
          fVar22 = fVar22 + fVar20;
        }
        for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar7 + uVar8 * 4) =
               *(float *)((long)pvVar7 + uVar8 * 4) * (1.0 / fVar22);
        }
        pvVar7 = (void *)((long)pvVar7 + sVar2 * (long)(int)uVar5);
      }
      return 0;
    }
    uVar5 = uVar5 ^ 3;
    if (uVar5 == 0 && uVar1 == 0) {
      iVar17 = bottom_top_blob->w;
      iVar18 = bottom_top_blob->h;
      iVar12 = bottom_top_blob->c;
      max.elemsize._0_4_ = 0;
      max.elemsize._4_4_ = 0;
      max.elempack = 0;
      max.data = (void *)0x0;
      max.refcount._0_4_ = 0;
      max.refcount._4_4_ = 0;
      max.allocator = (Allocator *)0x0;
      max.dims = 0;
      max.w = 0;
      max.h = 0;
      max.c = 0;
      max.cstep = 0;
      Mat::create(&max,iVar17,iVar18,sVar2,opt->workspace_allocator);
      iVar16 = -100;
      if ((max.data == (void *)0x0) || ((long)max.c * max.cstep == 0)) goto LAB_0013ca5c;
      Mat::fill(&max,-3.4028235e+38);
      uVar6 = 0;
      uVar11 = (ulong)(uint)(iVar18 * iVar17);
      if (iVar18 * iVar17 < 1) {
        uVar11 = uVar6;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      while (iVar16 = (int)uVar6, iVar16 != iVar12) {
        Mat::channel(&sum,bottom_top_blob,iVar16);
        pvVar7 = sum.data;
        Mat::~Mat(&sum);
        for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          fVar21 = *(float *)((long)pvVar7 + uVar6 * 4);
          fVar22 = *(float *)((long)max.data + uVar6 * 4);
          if (fVar21 <= fVar22) {
            fVar21 = fVar22;
          }
          *(float *)((long)max.data + uVar6 * 4) = fVar21;
        }
        uVar6 = (ulong)(iVar16 + 1);
      }
      sum.elemsize._0_4_ = 0;
      sum.elemsize._4_4_ = 0;
      sum.elempack = 0;
      sum.data = (void *)0x0;
      sum.refcount._0_4_ = 0;
      sum.refcount._4_4_ = 0;
      sum.allocator = (Allocator *)0x0;
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.c = 0;
      sum.cstep = 0;
      Mat::create(&sum,iVar17,iVar18,sVar2,opt->workspace_allocator);
      iVar16 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        for (iVar17 = 0; iVar17 != iVar12; iVar17 = iVar17 + 1) {
          Mat::channel(&local_70,bottom_top_blob,iVar17);
          pvVar13 = local_70.data;
          Mat::~Mat(&local_70);
          pvVar4 = max.data;
          pvVar7 = sum.data;
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            fVar21 = expf(*(float *)((long)pvVar13 + uVar6 * 4) -
                          *(float *)((long)pvVar4 + uVar6 * 4));
            *(float *)((long)pvVar13 + uVar6 * 4) = fVar21;
            *(float *)((long)pvVar7 + uVar6 * 4) = fVar21 + *(float *)((long)pvVar7 + uVar6 * 4);
          }
        }
        iVar16 = 0;
        for (iVar17 = 0; iVar17 != iVar12; iVar17 = iVar17 + 1) {
          Mat::channel(&local_70,bottom_top_blob,iVar17);
          pvVar7 = local_70.data;
          Mat::~Mat(&local_70);
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            *(float *)((long)pvVar7 + uVar6 * 4) =
                 *(float *)((long)pvVar7 + uVar6 * 4) / *(float *)((long)sum.data + uVar6 * 4);
          }
        }
      }
    }
    else {
      if ((uVar1 ^ 1) != 0 || uVar5 != 0) {
        if (uVar5 == 0 && uVar1 == 2) {
          uVar5 = bottom_top_blob->w;
          uVar11 = 0;
          if (0 < (int)uVar5) {
            uVar11 = (ulong)uVar5;
          }
          iVar17 = bottom_top_blob->c;
          iVar18 = bottom_top_blob->h;
          if (bottom_top_blob->h < 1) {
            iVar18 = 0;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          for (iVar16 = 0; iVar16 != iVar17; iVar16 = iVar16 + 1) {
            Mat::channel(&max,bottom_top_blob,iVar16);
            pvVar7 = max.data;
            Mat::~Mat(&max);
            for (iVar12 = 0; iVar12 != iVar18; iVar12 = iVar12 + 1) {
              fVar21 = -3.4028235e+38;
              for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 + uVar6 * 4);
                if (fVar21 <= fVar22) {
                  fVar21 = fVar22;
                }
              }
              fVar22 = 0.0;
              for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
                fVar20 = expf(*(float *)((long)pvVar7 + uVar6 * 4) - fVar21);
                *(float *)((long)pvVar7 + uVar6 * 4) = fVar20;
                fVar22 = fVar22 + fVar20;
              }
              for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar7 + uVar6 * 4) =
                     *(float *)((long)pvVar7 + uVar6 * 4) * (1.0 / fVar22);
              }
              pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar5 * 4);
            }
          }
          return 0;
        }
        return 0;
      }
      uVar5 = bottom_top_blob->w;
      iVar17 = bottom_top_blob->h;
      iVar18 = bottom_top_blob->c;
      max.elemsize._0_4_ = 0;
      max.elemsize._4_4_ = 0;
      max.elempack = 0;
      max.data = (void *)0x0;
      max.refcount._0_4_ = 0;
      max.refcount._4_4_ = 0;
      max.allocator = (Allocator *)0x0;
      max.dims = 0;
      max.w = 0;
      max.h = 0;
      max.c = 0;
      max.cstep = 0;
      Mat::create(&max,uVar5,iVar18,sVar2,opt->workspace_allocator);
      iVar16 = -100;
      if ((max.data == (void *)0x0) || ((long)max.c * max.cstep == 0)) goto LAB_0013ca5c;
      Mat::fill(&max,-3.4028235e+38);
      iVar16 = 0;
      uVar11 = 0;
      if (0 < (int)uVar5) {
        uVar11 = (ulong)uVar5;
      }
      if (iVar17 < 1) {
        iVar17 = iVar16;
      }
      iVar12 = 0;
      if (0 < iVar18) {
        iVar12 = iVar18;
      }
      lVar15 = (long)(int)uVar5 * 4;
      for (; iVar16 != iVar12; iVar16 = iVar16 + 1) {
        Mat::channel(&sum,bottom_top_blob,iVar16);
        pvVar7 = sum.data;
        Mat::~Mat(&sum);
        lVar9 = (long)(max.w * iVar16) * CONCAT44(max.elemsize._4_4_,(undefined4)max.elemsize);
        for (iVar10 = 0; iVar10 != iVar17; iVar10 = iVar10 + 1) {
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            fVar21 = *(float *)((long)pvVar7 + uVar6 * 4);
            fVar22 = *(float *)((long)max.data + uVar6 * 4 + lVar9);
            if (fVar21 <= fVar22) {
              fVar21 = fVar22;
            }
            *(float *)((long)max.data + uVar6 * 4 + lVar9) = fVar21;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar15);
        }
      }
      sum.elemsize._0_4_ = 0;
      sum.elemsize._4_4_ = 0;
      sum.elempack = 0;
      sum.data = (void *)0x0;
      sum.refcount._0_4_ = 0;
      sum.refcount._4_4_ = 0;
      sum.allocator = (Allocator *)0x0;
      sum.dims = 0;
      sum.w = 0;
      sum.h = 0;
      sum.c = 0;
      sum.cstep = 0;
      Mat::create(&sum,uVar5,iVar18,sVar2,opt->workspace_allocator);
      iVar16 = -100;
      if ((sum.data != (void *)0x0) && ((long)sum.c * sum.cstep != 0)) {
        Mat::fill(&sum,0.0);
        for (iVar18 = 0; iVar18 != iVar12; iVar18 = iVar18 + 1) {
          Mat::channel(&local_70,bottom_top_blob,iVar18);
          pvVar13 = local_70.data;
          Mat::~Mat(&local_70);
          pvVar4 = max.data;
          pvVar7 = sum.data;
          lVar19 = (long)(sum.w * iVar18) * CONCAT44(sum.elemsize._4_4_,(undefined4)sum.elemsize);
          iVar16 = max.w * iVar18;
          lVar9 = CONCAT44(max.elemsize._4_4_,(undefined4)max.elemsize);
          for (iVar10 = 0; iVar10 != iVar17; iVar10 = iVar10 + 1) {
            for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
              fVar21 = expf(*(float *)((long)pvVar13 + uVar6 * 4) -
                            *(float *)((long)pvVar4 + uVar6 * 4 + iVar16 * lVar9));
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar21;
              *(float *)((long)pvVar7 + uVar6 * 4 + lVar19) =
                   fVar21 + *(float *)((long)pvVar7 + uVar6 * 4 + lVar19);
            }
            pvVar13 = (void *)((long)pvVar13 + lVar15);
          }
        }
        iVar16 = 0;
        for (iVar18 = 0; iVar18 != iVar12; iVar18 = iVar18 + 1) {
          Mat::channel(&local_70,bottom_top_blob,iVar18);
          pvVar7 = local_70.data;
          Mat::~Mat(&local_70);
          for (iVar10 = 0; iVar10 != iVar17; iVar10 = iVar10 + 1) {
            for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar7 + uVar6 * 4) /
                   *(float *)((long)sum.data +
                             uVar6 * 4 +
                             (long)(sum.w * iVar18) *
                             CONCAT44(sum.elemsize._4_4_,(undefined4)sum.elemsize));
            }
            pvVar7 = (void *)((long)pvVar7 + lVar15);
          }
        }
      }
    }
    Mat::~Mat(&sum);
  }
LAB_0013ca5c:
  Mat::~Mat(&max);
  return iVar16;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}